

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::Message::Utf8DebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  scoped_ptr<const_google::protobuf::TextFormat::FieldValuePrinter> sVar1;
  FieldValuePrinter *pFVar2;
  Printer printer;
  Printer local_70;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&local_70);
  pFVar2 = (FieldValuePrinter *)operator_new(8);
  pFVar2->_vptr_FieldValuePrinter = (_func_int **)&PTR__FieldValuePrinter_00427a18;
  sVar1.ptr_ = local_70.default_field_value_printer_.ptr_;
  if ((local_70.default_field_value_printer_.ptr_ != pFVar2) &&
     (sVar1.ptr_ = pFVar2, local_70.default_field_value_printer_.ptr_ != (FieldValuePrinter *)0x0))
  {
    (*(local_70.default_field_value_printer_.ptr_)->_vptr_FieldValuePrinter[1])();
  }
  local_70.default_field_value_printer_.ptr_ = sVar1.ptr_;
  local_70.expand_any_ = true;
  TextFormat::Printer::PrintToString(&local_70,this,__return_storage_ptr__);
  TextFormat::Printer::~Printer(&local_70);
  return __return_storage_ptr__;
}

Assistant:

string Message::Utf8DebugString() const {
  string debug_string;

  TextFormat::Printer printer;
  printer.SetUseUtf8StringEscaping(true);
  printer.SetExpandAny(true);

  printer.PrintToString(*this, &debug_string);

  return debug_string;
}